

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3IdListDelete(sqlite3 *db,IdList *pList)

{
  long lVar1;
  long lVar2;
  
  if (pList != (IdList *)0x0) {
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < pList->nId; lVar1 = lVar1 + 1) {
      sqlite3DbFree(db,*(void **)((long)&pList->a->zName + lVar2));
      lVar2 = lVar2 + 0x10;
    }
    sqlite3DbFree(db,pList->a);
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3IdListDelete(sqlite3 *db, IdList *pList){
  int i;
  if( pList==0 ) return;
  for(i=0; i<pList->nId; i++){
    sqlite3DbFree(db, pList->a[i].zName);
  }
  sqlite3DbFree(db, pList->a);
  sqlite3DbFreeNN(db, pList);
}